

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

int lookup_proto(compiler_state_t *cstate,char *name,int proto)

{
  int iVar1;
  char *fmt;
  
  if (proto != 0) {
    if (proto == 1) {
      iVar1 = pcap_nametoeproto(name);
      if (iVar1 != -1) {
        return iVar1;
      }
      iVar1 = pcap_nametollc(name);
      if (iVar1 != -1) {
        return iVar1;
      }
      fmt = "unknown ether proto \'%s\'";
      goto LAB_0010d293;
    }
    if (proto != 2) {
      if (proto == 0x18) {
        iVar1 = strcmp(name,"esis");
        if (iVar1 == 0) {
          return 0x82;
        }
        iVar1 = strcmp(name,"isis");
        if (iVar1 == 0) {
          return 0x83;
        }
        iVar1 = strcmp(name,"clnp");
        if (iVar1 == 0) {
          return 0x81;
        }
        fmt = "unknown osi proto \'%s\'";
        goto LAB_0010d293;
      }
      if (proto != 0x11) {
        return -1;
      }
    }
  }
  iVar1 = pcap_nametoproto(name);
  if (iVar1 != -1) {
    return iVar1;
  }
  fmt = "unknown ip proto \'%s\'";
LAB_0010d293:
  bpf_error(cstate,fmt,name);
}

Assistant:

static int
lookup_proto(compiler_state_t *cstate, const char *name, int proto)
{
	register int v;

	switch (proto) {

	case Q_DEFAULT:
	case Q_IP:
	case Q_IPV6:
		v = pcap_nametoproto(name);
		if (v == PROTO_UNDEF)
			bpf_error(cstate, "unknown ip proto '%s'", name);
		break;

	case Q_LINK:
		/* XXX should look up h/w protocol type based on cstate->linktype */
		v = pcap_nametoeproto(name);
		if (v == PROTO_UNDEF) {
			v = pcap_nametollc(name);
			if (v == PROTO_UNDEF)
				bpf_error(cstate, "unknown ether proto '%s'", name);
		}
		break;

	case Q_ISO:
		if (strcmp(name, "esis") == 0)
			v = ISO9542_ESIS;
		else if (strcmp(name, "isis") == 0)
			v = ISO10589_ISIS;
		else if (strcmp(name, "clnp") == 0)
			v = ISO8473_CLNP;
		else
			bpf_error(cstate, "unknown osi proto '%s'", name);
		break;

	default:
		v = PROTO_UNDEF;
		break;
	}
	return v;
}